

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DFsScript::Destroy(DFsScript *this)

{
  TObjPtr<DFsSection> TVar1;
  long lVar2;
  
  ClearVariables(this,true);
  ClearSections(this);
  lVar2 = 0x29;
  do {
    TVar1.field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[lVar2 + -7].field_0.p;
    if (TVar1.field_0 != (DFsSection *)0x0) {
      if ((*(byte *)((long)TVar1.field_0 + 0x20) & 0x20) == 0) {
        (**(code **)(*(long *)TVar1.field_0 + 0x20))();
      }
      this->sections[lVar2 + -7].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x12a);
  (this->parent).field_0.p = (DFsScript *)0x0;
  if (this->data != (char *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (char *)0x0;
  (this->parent).field_0.p = (DFsScript *)0x0;
  (this->trigger).field_0.p = (AActor *)0x0;
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DFsScript::Destroy()
{
	ClearVariables(true);
	ClearSections();
	ClearChildren();
	parent = NULL;
	if (data != NULL) delete [] data;
	data = NULL;
	parent = NULL;
	trigger = NULL;
	Super::Destroy();
}